

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_environment.c
# Opt level: O3

void apprun_env_set(char *name,char *value,char *orig_value,char *start_value)

{
  char *name_00;
  char *name_01;
  
  apprun_update_env(name,value);
  name_00 = apprun_prefix_str("APPRUN_ORIGINAL_",name);
  apprun_update_env(name_00,orig_value);
  name_01 = apprun_prefix_str("APPRUN_STARTUP_",name);
  apprun_update_env(name_01,start_value);
  free(name_00);
  free(name_01);
  return;
}

Assistant:

void apprun_env_set(const char *name, const char *value, const char *orig_value, const char *start_value) {
    apprun_update_env(name, value);

    char *orig_name = apprun_prefix_str(APPRUN_ENV_ORIG_PREFIX, name);
    apprun_update_env(orig_name, orig_value);


    char *startup_name = apprun_prefix_str(APPRUN_ENV_STARTUP_PREFIX, name);
    apprun_update_env(startup_name, start_value);

#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: set env %s=%s\n", name, value);
#endif

    free(orig_name);
    free(startup_name);
}